

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

void __thiscall libchars::command_cursor::command_cursor(command_cursor *this,command_cursor *n)

{
  _Elt_pointer ppcVar1;
  _Elt_pointer ppcVar2;
  _Elt_pointer ppcVar3;
  command_node **ppcVar4;
  size_t sVar5;
  
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::
  _M_initialize_map((_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                     *)this,0);
  (this->w)._M_dataplus._M_p = (pointer)&(this->w).field_2;
  (this->w)._M_string_length = 0;
  (this->w).field_2._M_local_buf[0] = '\0';
  ppcVar1 = (n->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppcVar2 = (n->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar2 == ppcVar1) {
    ppcVar4 = &n->root;
  }
  else {
    ppcVar3 = ppcVar2;
    if (ppcVar2 ==
        (n->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar3 = (n->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppcVar4 = ppcVar3 + -1;
  }
  sVar5 = 0;
  this->root = *ppcVar4;
  this->idx = 0;
  if (ppcVar2 == ppcVar1) {
    sVar5 = n->root_idx;
  }
  this->root_idx = sVar5 + n->idx;
  return;
}

Assistant:

command_cursor::command_cursor(const command_cursor &n) :
        root(n.current()),idx(0)
    {
        if (n.S.empty())
            root_idx = n.root_idx + n.idx;
        else
            root_idx = n.idx;
    }